

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameParseSql(Parse *p,char *zDb,sqlite3 *db,char *zSql,int bTemp)

{
  int iVar1;
  char *in_RCX;
  sqlite3 *in_RDX;
  undefined8 *in_RDI;
  int in_R8D;
  int rc;
  undefined4 in_stack_ffffffffffffffc8;
  u8 uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  sqlite3ParseObjectInit
            ((Parse *)CONCAT44(in_R8D,0xaaaaaaaa),
             (sqlite3 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (in_RCX == (char *)0x0) {
    local_4 = 7;
  }
  else {
    iVar1 = sqlite3_strnicmp(in_RCX,"CREATE ",7);
    if (iVar1 == 0) {
      if (in_R8D == 0) {
        iVar1 = sqlite3FindDbName(in_RDX,in_RCX);
        uVar2 = (u8)iVar1;
      }
      else {
        uVar2 = '\x01';
      }
      (in_RDX->init).iDb = uVar2;
      *(undefined1 *)((long)in_RDI + 0x134) = 2;
      *in_RDI = in_RDX;
      *(undefined2 *)(in_RDI + 0x1c) = 1;
      local_4 = sqlite3RunParser((Parse *)zSql,(char *)CONCAT44(bTemp,rc));
      if (in_RDX->mallocFailed != '\0') {
        local_4 = 7;
      }
      if ((((local_4 == 0) && (in_RDI[0x2c] == 0)) && (in_RDI[0x2d] == 0)) && (in_RDI[0x2e] == 0)) {
        local_4 = sqlite3CorruptError(0);
      }
      (in_RDX->init).iDb = '\0';
    }
    else {
      local_4 = sqlite3CorruptError(0);
    }
  }
  return local_4;
}

Assistant:

static int renameParseSql(
  Parse *p,                       /* Memory to use for Parse object */
  const char *zDb,                /* Name of schema SQL belongs to */
  sqlite3 *db,                    /* Database handle */
  const char *zSql,               /* SQL to parse */
  int bTemp                       /* True if SQL is from temp schema */
){
  int rc;

  sqlite3ParseObjectInit(p, db);
  if( zSql==0 ){
    return SQLITE_NOMEM;
  }
  if( sqlite3StrNICmp(zSql,"CREATE ",7)!=0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  db->init.iDb = bTemp ? 1 : sqlite3FindDbName(db, zDb);
  p->eParseMode = PARSE_MODE_RENAME;
  p->db = db;
  p->nQueryLoop = 1;
  rc = sqlite3RunParser(p, zSql);
  if( db->mallocFailed ) rc = SQLITE_NOMEM;
  if( rc==SQLITE_OK
   && NEVER(p->pNewTable==0 && p->pNewIndex==0 && p->pNewTrigger==0)
  ){
    rc = SQLITE_CORRUPT_BKPT;
  }

#ifdef SQLITE_DEBUG
  /* Ensure that all mappings in the Parse.pRename list really do map to
  ** a part of the input string.  */
  if( rc==SQLITE_OK ){
    int nSql = sqlite3Strlen30(zSql);
    RenameToken *pToken;
    for(pToken=p->pRename; pToken; pToken=pToken->pNext){
      assert( pToken->t.z>=zSql && &pToken->t.z[pToken->t.n]<=&zSql[nSql] );
    }
  }
#endif

  db->init.iDb = 0;
  return rc;
}